

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O1

Abc_Obj_t *
Abc_NtkDsdConstructNode
          (Dsd_Manager_t *pManDsd,Dsd_Node_t *pNodeDsd,Abc_Ntk_t *pNtkNew,int *pCounters)

{
  DdManager *ddDestination;
  Dsd_Type_t DVar1;
  uint uVar2;
  int iVar3;
  DdManager *dd;
  Abc_Obj_t *pObj;
  Dsd_Node_t *pDVar4;
  DdNode *pDVar5;
  DdNode *n;
  long lVar6;
  ulong uVar7;
  uint i;
  
  dd = Dsd_ManagerReadDd(pManDsd);
  pObj = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
  DVar1 = Dsd_NodeReadType(pNodeDsd);
  uVar2 = Dsd_NodeReadDecsNum(pNodeDsd);
  if ((int)uVar2 < 2) {
    __assert_fail("nDecs > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDsd.c"
                  ,0xe8,
                  "Abc_Obj_t *Abc_NtkDsdConstructNode(Dsd_Manager_t *, Dsd_Node_t *, Abc_Ntk_t *, int *)"
                 );
  }
  i = 0;
  do {
    pDVar4 = Dsd_NodeReadDec(pNodeDsd,i);
    iVar3 = Dsd_NodeReadMark((Dsd_Node_t *)((ulong)pDVar4 & 0xfffffffffffffffe));
    Abc_ObjAddFanin(pObj,(Abc_Obj_t *)(long)iVar3);
    if ((DVar1 != DSD_NODE_OR) && (((ulong)pDVar4 & 1) != 0)) {
      __assert_fail("Type == DSD_NODE_OR || !Dsd_IsComplement(pFaninDsd)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDsd.c"
                    ,0xee,
                    "Abc_Obj_t *Abc_NtkDsdConstructNode(Dsd_Manager_t *, Dsd_Node_t *, Abc_Ntk_t *, int *)"
                   );
    }
    i = i + 1;
  } while (uVar2 != i);
  if (4 < DVar1 - DSD_NODE_CONST1) {
switchD_002aef8a_caseD_2:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDsd.c"
                  ,0x128,
                  "Abc_Obj_t *Abc_NtkDsdConstructNode(Dsd_Manager_t *, Dsd_Node_t *, Abc_Ntk_t *, int *)"
                 );
  }
  ddDestination = (DdManager *)pNtkNew->pManFunc;
  switch(DVar1) {
  case DSD_NODE_CONST1:
    n = ddDestination->one;
    Cudd_Ref(n);
    break;
  case DSD_NODE_BUF:
    goto switchD_002aef8a_caseD_2;
  case DSD_NODE_OR:
    pDVar5 = (DdNode *)((ulong)ddDestination->one ^ 1);
    Cudd_Ref(pDVar5);
    uVar7 = 0;
    do {
      pDVar4 = Dsd_NodeReadDec(pNodeDsd,(int)uVar7);
      n = Cudd_bddOr(ddDestination,pDVar5,
                     (DdNode *)((ulong)((uint)pDVar4 & 1) ^ (ulong)ddDestination->vars[uVar7]));
      Cudd_Ref(n);
      Cudd_RecursiveDeref(ddDestination,pDVar5);
      uVar7 = uVar7 + 1;
      pDVar5 = n;
    } while (uVar2 != uVar7);
    break;
  case DSD_NODE_EXOR:
    pDVar5 = (DdNode *)((ulong)ddDestination->one ^ 1);
    Cudd_Ref(pDVar5);
    uVar7 = 0;
    do {
      n = Cudd_bddXor(ddDestination,pDVar5,ddDestination->vars[uVar7]);
      Cudd_Ref(n);
      Cudd_RecursiveDeref(ddDestination,pDVar5);
      uVar7 = uVar7 + 1;
      pDVar5 = n;
    } while (uVar2 != uVar7);
    break;
  case DSD_NODE_PRIME:
    if (pCounters != (int *)0x0) {
      lVar6 = 0x28;
      if ((int)uVar2 < 10) {
        lVar6 = (ulong)uVar2 << 2;
      }
      *(int *)((long)pCounters + lVar6) = *(int *)((long)pCounters + lVar6) + 1;
    }
    pDVar5 = Dsd_TreeGetPrimeFunction(dd,pNodeDsd);
    Cudd_Ref(pDVar5);
    n = Extra_TransferLevelByLevel(dd,ddDestination,pDVar5);
    Cudd_Ref(n);
    Cudd_RecursiveDeref(dd,pDVar5);
  }
  (pObj->field_5).pData = n;
  Dsd_NodeSetMark(pNodeDsd,(int)pObj);
  return pObj;
}

Assistant:

Abc_Obj_t * Abc_NtkDsdConstructNode( Dsd_Manager_t * pManDsd, Dsd_Node_t * pNodeDsd, Abc_Ntk_t * pNtkNew, int * pCounters )
{
    DdManager * ddDsd = Dsd_ManagerReadDd( pManDsd );
    DdManager * ddNew = (DdManager *)pNtkNew->pManFunc;
    Dsd_Node_t * pFaninDsd;
    Abc_Obj_t * pNodeNew, * pFanin;
    DdNode * bLocal = NULL, * bTemp, * bVar;
    Dsd_Type_t Type;
    int i, nDecs;

    // create the new node
    pNodeNew = Abc_NtkCreateNode( pNtkNew );
    // add the fanins
    Type  = Dsd_NodeReadType( pNodeDsd );
    nDecs = Dsd_NodeReadDecsNum( pNodeDsd );
    assert( nDecs > 1 );
    for ( i = 0; i < nDecs; i++ )
    {
        pFaninDsd  = Dsd_NodeReadDec( pNodeDsd, i );
        pFanin     = (Abc_Obj_t *)(ABC_PTRINT_T)Dsd_NodeReadMark(Dsd_Regular(pFaninDsd));
        Abc_ObjAddFanin( pNodeNew, pFanin );
        assert( Type == DSD_NODE_OR || !Dsd_IsComplement(pFaninDsd) );
    }

    // create the local function depending on the type of the node
    ddNew = (DdManager *)pNtkNew->pManFunc;
    switch ( Type )
    {
        case DSD_NODE_CONST1:
        {
            bLocal = ddNew->one; Cudd_Ref( bLocal );
            break;
        }
        case DSD_NODE_OR:
        {
            bLocal = Cudd_Not(ddNew->one); Cudd_Ref( bLocal );
            for ( i = 0; i < nDecs; i++ )
            {
                pFaninDsd  = Dsd_NodeReadDec( pNodeDsd, i );
                bVar   = Cudd_NotCond( ddNew->vars[i], Dsd_IsComplement(pFaninDsd) );
                bLocal = Cudd_bddOr( ddNew, bTemp = bLocal, bVar );               Cudd_Ref( bLocal );
                Cudd_RecursiveDeref( ddNew, bTemp );
            }
            break;
        }
        case DSD_NODE_EXOR:
        {
            bLocal = Cudd_Not(ddNew->one); Cudd_Ref( bLocal );
            for ( i = 0; i < nDecs; i++ )
            {
                bLocal = Cudd_bddXor( ddNew, bTemp = bLocal, ddNew->vars[i] );    Cudd_Ref( bLocal );
                Cudd_RecursiveDeref( ddNew, bTemp );
            }
            break;
        }
        case DSD_NODE_PRIME:
        {
            if ( pCounters )
            {
                if ( nDecs < 10 )
                    pCounters[nDecs]++;
                else
                    pCounters[10]++;
            }
            bLocal = Dsd_TreeGetPrimeFunction( ddDsd, pNodeDsd );                Cudd_Ref( bLocal );
            bLocal = Extra_TransferLevelByLevel( ddDsd, ddNew, bTemp = bLocal ); Cudd_Ref( bLocal );
/*
if ( nDecs == 3 )
{
Extra_bddPrint( ddDsd, bTemp );
printf( "\n" );
}
*/
            Cudd_RecursiveDeref( ddDsd, bTemp );
            // bLocal is now in the new BDD manager
            break;
        }
        default:
        {
            assert( 0 );
            break;
        }
    }
    pNodeNew->pData = bLocal;
    Dsd_NodeSetMark( pNodeDsd, (int)(ABC_PTRINT_T)pNodeNew );
    return pNodeNew;
}